

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall CVmRun::push_string(CVmRun *this,char *str)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_obj_id_t vVar3;
  size_t bytelen;
  
  if (str != (char *)0x0) {
    bytelen = strlen(str);
    pvVar2 = sp_;
    sp_ = sp_ + 1;
    vVar3 = CVmObjString::create(0,str,bytelen);
    pvVar2->typ = VM_OBJ;
    (pvVar2->val).obj = vVar3;
    return;
  }
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_NIL;
  return;
}

Assistant:

void CVmRun::push_string(VMG_ const char *str, size_t len)
{
    if (str != 0)
        push()->set_obj(CVmObjString::create(vmg_ FALSE, str, len));
    else
        push()->set_nil();
}